

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONMemory.h
# Opt level: O2

char * json_malloc<char>(size_t count)

{
  char *pcVar1;
  allocator local_31;
  json_string local_30;
  
  pcVar1 = (char *)malloc(count);
  std::__cxx11::string::string((string *)&local_30,"Out of memory",&local_31);
  JSONDebug::_JSON_ASSERT(pcVar1 != (char *)0x0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar1;
}

Assistant:

static inline T * json_malloc(size_t count) json_nothrow {
	   #ifdef JSON_DEBUG  //in debug mode, see if the malloc was successful
		  void * result = std::malloc(count * sizeof(T));
		  JSON_ASSERT(result != 0, JSON_TEXT("Out of memory"));
		  #ifdef JSON_NULL_MEMORY
			 std::memset(result, '\0', count  * sizeof(T));
		  #endif
		  return (T *)result;
	   #else
		  return (T *)std::malloc(count * sizeof(T));
	   #endif
    }